

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wskey.cpp
# Opt level: O2

void __thiscall Sha1_Test1_Test::TestBody(Sha1_Test1_Test *this)

{
  result_type *digest_00;
  char *pcVar1;
  AssertHelper local_e0;
  AssertionResult gtest_ar;
  string local_c8;
  char test [3];
  result_type digest;
  sha1 sha;
  
  sha.intermediate_hash_._M_elems[4] = 0xc3d2e1f0;
  sha.intermediate_hash_._M_elems[0] = 0x67452301;
  sha.intermediate_hash_._M_elems[1] = 0xefcdab89;
  sha.intermediate_hash_._M_elems[2] = 0x98badcfe;
  sha.intermediate_hash_._M_elems[3] = 0x10325476;
  sha.length_ = 0;
  test[2] = 'c';
  sha.index_ = 0;
  test[0] = 'a';
  test[1] = 'b';
  sha.computed_ = false;
  sha.corrupted_ = false;
  local_c8._0_16_ = pstore::gsl::make_span<unsigned_char_const>((uchar *)test,3);
  pstore::http::sha1::input(&sha,(span<const_unsigned_char,__1L> *)&local_c8);
  pstore::http::sha1::result(&digest,&sha);
  local_c8._M_string_length = 0x6cc2507871253eba;
  local_c8._M_dataplus._M_p = (pointer)0x6a810647363e99a9;
  local_c8.field_2._M_allocated_capacity._0_4_ = 0x9dd8d09c;
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,20ul>>>>
  ::operator()(&gtest_ar,(char *)&local_c8,(array<unsigned_char,_20UL> *)"digest");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::http::sha1::digest_to_base64_abi_cxx11_(&local_c8,(sha1 *)&digest,digest_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            ((internal *)&gtest_ar,"pstore::http::sha1::digest_to_base64 (digest)",
             "\"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=\"",&local_c8,
             (char (*) [29])"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
  std::__cxx11::string::~string((string *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST (Sha1, Test1) {
    char const test[] = {'a', 'b', 'c'};
    PSTORE_STATIC_ASSERT (sizeof (char) == sizeof (std::uint8_t));

    pstore::http::sha1 sha;
    sha.input (pstore::gsl::make_span (reinterpret_cast<std::uint8_t const *> (test),
                                       pstore::array_elements (test)));
    pstore::http::sha1::result_type const digest = sha.result ();
    EXPECT_THAT (digest, testing::ContainerEq (pstore::http::sha1::result_type{
                             {0xA9, 0x99, 0x3E, 0x36, 0x47, 0x06, 0x81, 0x6A, 0xBA, 0x3E,
                              0x25, 0x71, 0x78, 0x50, 0xC2, 0x6C, 0x9C, 0xD0, 0xD8, 0x9D}}));

    EXPECT_EQ (pstore::http::sha1::digest_to_base64 (digest), "qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
}